

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

ChNodeMeshless * __thiscall
chrono::fea::ChNodeMeshless::operator=(ChNodeMeshless *this,ChNodeMeshless *other)

{
  ChCollisionModel *pCVar1;
  double dVar2;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  if (other != this) {
    ChNodeXYZ::operator=(&this->super_ChNodeXYZ,&other->super_ChNodeXYZ);
    (*this->collision_model->_vptr_ChCollisionModel[3])();
    pCVar1 = this->collision_model;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_48,
               &(other->container->matsurface).
                super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    (*pCVar1->_vptr_ChCollisionModel[0x13])(other->coll_rad,pCVar1,&_Stack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
    (*this->collision_model->_vptr_ChCollisionModel[0x16])
              (this->collision_model,&(this->super_ChNodeXYZ).field_0x50);
    (this->pos_ref).m_data[0] = (other->pos_ref).m_data[0];
    (this->pos_ref).m_data[1] = (other->pos_ref).m_data[1];
    (this->pos_ref).m_data[2] = (other->pos_ref).m_data[2];
    (this->UserForce).m_data[0] = (other->UserForce).m_data[0];
    (this->UserForce).m_data[1] = (other->UserForce).m_data[1];
    (this->UserForce).m_data[2] = (other->UserForce).m_data[2];
    SetKernelRadius(this,other->h_rad);
    SetCollisionRadius(this,other->coll_rad);
    (**(code **)((long)(other->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))(other);
    (**(code **)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + 0x98))(this);
    dVar2 = other->density;
    this->volume = other->volume;
    this->density = dVar2;
    this->hardening = other->hardening;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
              ((Matrix<double,_6,_1,_0,_6,_1> *)&this->t_strain,
               (Matrix<double,_6,_1,_0,_6,_1> *)&other->t_strain);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
              ((Matrix<double,_6,_1,_0,_6,_1> *)&this->p_strain,
               (Matrix<double,_6,_1,_0,_6,_1> *)&other->p_strain);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
              ((Matrix<double,_6,_1,_0,_6,_1> *)&this->e_strain,
               (Matrix<double,_6,_1,_0,_6,_1> *)&other->e_strain);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
              ((Matrix<double,_6,_1,_0,_6,_1> *)&this->e_stress,
               (Matrix<double,_6,_1,_0,_6,_1> *)&other->e_stress);
    this->container = other->container;
    ChVariablesNode::operator=(&this->variables,&other->variables);
  }
  return this;
}

Assistant:

ChNodeMeshless& ChNodeMeshless::operator=(const ChNodeMeshless& other) {
    if (&other == this)
        return *this;

    ChNodeXYZ::operator=(other);

    collision_model->ClearModel();
    collision_model->AddPoint(other.container->GetMaterialSurface(), other.coll_rad);

    collision_model->SetContactable(this);

    pos_ref = other.pos_ref;
    UserForce = other.UserForce;
    SetKernelRadius(other.h_rad);
    SetCollisionRadius(other.coll_rad);
    SetMass(other.GetMass());
    volume = other.volume;
    density = other.density;
    hardening = other.hardening;

    t_strain = other.t_strain;
    p_strain = other.p_strain;
    e_strain = other.e_strain;
    e_stress = other.e_stress;

    container = other.container;

    variables = other.variables;

    return *this;
}